

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O2

string * __thiscall
cmTimestamp::AddTimestampComponent_abi_cxx11_
          (string *__return_storage_ptr__,cmTimestamp *this,char flag,tm *timeStruct)

{
  size_t sVar1;
  string formatString;
  char buffer [16];
  
  std::__cxx11::string::string((string *)&formatString,"%",(allocator *)buffer);
  std::__cxx11::string::push_back((char)&formatString);
  if (((int)flag - 0x48U < 0x32) &&
     ((0x2802410022823U >> ((ulong)((int)flag - 0x48U) & 0x3f) & 1) != 0)) {
    sVar1 = strftime(buffer,0x10,formatString._M_dataplus._M_p,(tm *)timeStruct);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,buffer,buffer + sVar1);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)formatString._M_dataplus._M_p == &formatString.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(formatString.field_2._M_allocated_capacity._1_7_,
                    formatString.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = formatString.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = formatString._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(formatString.field_2._M_allocated_capacity._1_7_,
                    formatString.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = formatString._M_string_length;
    formatString._M_string_length = 0;
    formatString.field_2._M_local_buf[0] = '\0';
    formatString._M_dataplus._M_p = (pointer)&formatString.field_2;
  }
  std::__cxx11::string::~string((string *)&formatString);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::AddTimestampComponent(
  char flag, struct tm& timeStruct)
{
  std::string formatString = "%";
  formatString += flag;

  switch(flag)
    {
    case 'd':
    case 'H':
    case 'I':
    case 'j':
    case 'm':
    case 'M':
    case 'S':
    case 'U':
    case 'w':
    case 'y':
    case 'Y':
      break;
    default:
      {
      return formatString;
      }
    }

  char buffer[16];

  size_t size = strftime(buffer, sizeof(buffer),
    formatString.c_str(), &timeStruct);

  return std::string(buffer, size);
}